

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api_dump.cpp
# Opt level: O1

XrResult ApiDumpLayerXrCreateApiLayerInstance
                   (XrInstanceCreateInfo *info,XrApiLayerCreateInfo *apiLayerInfo,
                   XrInstance *instance)

{
  ulong uVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  XrApiLayerNextInfo *pXVar4;
  void *value;
  PFN_xrGetInstanceProcAddr get_inst_proc_addr;
  undefined1 *puVar5;
  long lVar6;
  _Alloc_hider instance_00;
  char cVar7;
  bool bVar8;
  char cVar9;
  int iVar10;
  XrResult XVar11;
  char *pcVar12;
  size_t sVar13;
  undefined8 *puVar14;
  long *plVar15;
  XrGeneratedDispatchTable *table;
  mapped_type *ppXVar16;
  invalid_argument *piVar17;
  uint uVar18;
  size_type *psVar19;
  ulong uVar20;
  undefined8 uVar21;
  ulong uVar22;
  long lVar23;
  string enabledextensionnames_prefix;
  string enabledextensioncount_prefix;
  string info_prefix;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  contents;
  string __str_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  string prefix_1;
  string enabledapilayernames_prefix;
  string applicationinfo_prefix;
  string next_prefix;
  string enabledapilayercount_prefix;
  string flags_prefix;
  unique_lock<std::mutex> mlock;
  ostringstream oss_enabledExtensionNames_array;
  ostringstream oss_enabledExtensionCount;
  XrInstance returned_instance;
  XrApiLayerCreateInfo new_api_layer_info;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a90;
  XrApiLayerCreateInfo *local_a70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a68;
  long *local_a48;
  long local_a40;
  long local_a38 [2];
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_a28;
  ulong *local_a10;
  uint local_a08;
  undefined4 uStack_a04;
  ulong local_a00 [2];
  ulong *local_9f0;
  long local_9e8;
  ulong local_9e0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9d0;
  undefined1 *local_9b0;
  long local_9a8;
  undefined1 local_9a0;
  undefined7 uStack_99f;
  long *local_990;
  undefined8 local_988;
  long local_980;
  undefined8 uStack_978;
  undefined1 *local_970;
  long local_968;
  undefined1 local_960;
  undefined7 uStack_95f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_950;
  long *local_930;
  long local_928;
  long local_920 [2];
  long *local_910;
  long local_908;
  long local_900 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8d0;
  XrInstance *local_8b0;
  string local_8a8;
  string local_888;
  string local_868;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_848;
  undefined1 local_830 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_820 [6];
  ios_base local_7c0 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b8 [3];
  ios_base local_648 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_540 [3];
  ios_base local_4d0 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8 [3];
  ios_base local_358 [264];
  XrApiLayerCreateInfo local_250;
  
  memset(&local_250,0,0x220);
  bVar8 = g_record_info.initialized;
  if (g_record_info.initialized == false) {
    g_record_info.initialized = true;
    g_record_info.type = RECORD_TEXT_COUT;
  }
  pcVar12 = getenv("XR_API_DUMP_EXPORT_TYPE");
  local_9b0 = &local_9a0;
  if (pcVar12 == (char *)0x0) {
    local_9a8 = 0;
    local_9a0 = 0;
  }
  else {
    sVar13 = strlen(pcVar12);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_9b0,pcVar12,pcVar12 + sVar13);
  }
  pcVar12 = getenv("XR_API_DUMP_FILE_NAME");
  local_970 = &local_960;
  if (pcVar12 == (char *)0x0) {
    local_968 = 0;
    local_960 = 0;
  }
  else {
    sVar13 = strlen(pcVar12);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_970,pcVar12,pcVar12 + sVar13);
  }
  if (local_968 != 0) {
    std::__cxx11::string::_M_assign((string *)&g_record_info.file_name);
    g_record_info.type = RECORD_TEXT_FILE;
  }
  if (local_9a8 != 0) {
    local_830._0_8_ = local_820;
    local_a70 = apiLayerInfo;
    std::__cxx11::string::_M_construct<char*>((string *)local_830,local_9b0,local_9b0 + local_9a8);
    uVar21 = local_830._0_8_;
    lVar6 = local_9a8;
    puVar5 = local_9b0;
    if (local_9a8 != 0) {
      lVar23 = 0;
      do {
        iVar10 = tolower((uint)(byte)puVar5[lVar23]);
        *(char *)(uVar21 + lVar23) = (char)iVar10;
        lVar23 = lVar23 + 1;
      } while (lVar6 != lVar23);
    }
    iVar10 = std::__cxx11::string::compare(local_830);
    if (iVar10 == 0) {
      g_record_info.type = RECORD_TEXT_FILE - (g_record_info.file_name._M_string_length == 0);
    }
    else {
      iVar10 = std::__cxx11::string::compare(local_830);
      if (iVar10 == 0 && bVar8 == false) {
        g_record_info.type = RECORD_HTML_FILE;
        bVar8 = ApiDumpLayerWriteHtmlHeader();
        if (!bVar8) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_830._0_8_ != local_820) {
            operator_delete((void *)local_830._0_8_,local_820[0]._M_allocated_capacity + 1);
          }
          XVar11 = XR_ERROR_INITIALIZATION_FAILED;
          goto LAB_00105394;
        }
      }
      else {
        iVar10 = std::__cxx11::string::compare(local_830);
        if (iVar10 == 0) {
          g_record_info.type = RECORD_CODE_FILE;
        }
      }
    }
    apiLayerInfo = local_a70;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_830._0_8_ != local_820) {
      operator_delete((void *)local_830._0_8_,local_820[0]._M_allocated_capacity + 1);
    }
  }
  XVar11 = XR_ERROR_INITIALIZATION_FAILED;
  if ((((((apiLayerInfo != (XrApiLayerCreateInfo *)0x0) &&
         (apiLayerInfo->structType == XR_LOADER_INTERFACE_STRUCT_API_LAYER_CREATE_INFO)) &&
        (apiLayerInfo->structVersion != 0)) &&
       ((0x21f < apiLayerInfo->structSize &&
        (pXVar4 = apiLayerInfo->nextInfo, pXVar4 != (XrApiLayerNextInfo *)0x0)))) &&
      ((pXVar4->structType == XR_LOADER_INTERFACE_STRUCT_API_LAYER_NEXT_INFO &&
       ((pXVar4->structVersion != 0 && (0x127 < pXVar4->structSize)))))) &&
     ((iVar10 = strcmp("XR_APILAYER_LUNARG_api_dump",pXVar4->layerName), iVar10 == 0 &&
      ((pXVar4->nextGetInstanceProcAddr != (PFN_xrGetInstanceProcAddr)0x0 &&
       (pXVar4->nextCreateApiLayerInstance != (PFN_xrCreateApiLayerInstance)0x0)))))) {
    local_a28.
    super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a28.
    super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a28.
    super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],char_const(&)[17],char_const(&)[1]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&local_a28,(char (*) [9])"XrResult",(char (*) [17])"xrCreateInstance",
               (char (*) [1])0x2a4b54);
    PointerToHexString<XrInstanceCreateInfo>(info);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[28],char_const(&)[5],std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&local_a28,(char (*) [28])"const XrInstanceCreateInfo*",(char (*) [5])"info",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_830);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_830._0_8_ != local_820) {
      operator_delete((void *)local_830._0_8_,local_820[0]._M_allocated_capacity + 1);
    }
    if (info != (XrInstanceCreateInfo *)0x0) {
      local_a48 = local_a38;
      local_a70 = apiLayerInfo;
      local_8b0 = instance;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a48,"info->","");
      std::__cxx11::to_string((string *)local_830,info->type);
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[16],char_const(&)[11],std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)&local_a28,(char (*) [16])"XrStructureType",(char (*) [11])"info->type",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_830);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_830._0_8_ != local_820) {
        operator_delete((void *)local_830._0_8_,local_820[0]._M_allocated_capacity + 1);
      }
      local_910 = local_900;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_910,local_a48,local_a40 + (long)local_a48);
      std::__cxx11::string::append((char *)&local_910);
      value = info->next;
      local_868._M_dataplus._M_p = (pointer)&local_868.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_868,local_910,local_908 + (long)local_910);
      bVar8 = ApiDumpDecodeNextChain((XrGeneratedDispatchTable *)0x0,value,&local_868,&local_a28);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_868._M_dataplus._M_p != &local_868.field_2) {
        operator_delete(local_868._M_dataplus._M_p,local_868.field_2._M_allocated_capacity + 1);
      }
      if (!bVar8) {
        piVar17 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(piVar17,"Invalid Operation");
        __cxa_throw(piVar17,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      local_8d0._M_dataplus._M_p = (pointer)&local_8d0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_8d0,local_a48,local_a40 + (long)local_a48);
      std::__cxx11::string::append((char *)&local_8d0);
      std::__cxx11::to_string((string *)local_830,info->createFlags);
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[22],std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)&local_a28,(char (*) [22])"XrInstanceCreateFlags",&local_8d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_830);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_830._0_8_ != local_820) {
        operator_delete((void *)local_830._0_8_,local_820[0]._M_allocated_capacity + 1);
      }
      local_930 = local_920;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_930,local_a48,local_a40 + (long)local_a48);
      std::__cxx11::string::append((char *)&local_930);
      local_888._M_dataplus._M_p = (pointer)&local_888.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_888,local_930,local_928 + (long)local_930);
      local_8a8._M_dataplus._M_p = (pointer)&local_8a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_8a8,"XrApplicationInfo","");
      bVar8 = ApiDumpOutputXrStruct
                        ((XrGeneratedDispatchTable *)0x0,&info->applicationInfo,&local_888,
                         &local_8a8,true,&local_a28);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_8a8._M_dataplus._M_p != &local_8a8.field_2) {
        operator_delete(local_8a8._M_dataplus._M_p,local_8a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_888._M_dataplus._M_p != &local_888.field_2) {
        operator_delete(local_888._M_dataplus._M_p,local_888.field_2._M_allocated_capacity + 1);
      }
      if (!bVar8) {
        piVar17 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(piVar17,"Invalid Operation");
        __cxa_throw(piVar17,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      local_8f0._M_dataplus._M_p = (pointer)&local_8f0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_8f0,local_a48,local_a40 + (long)local_a48);
      std::__cxx11::string::append((char *)&local_8f0);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_830);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_830,"0x",2);
      *(uint *)((long)local_820 + *(long *)(local_830._0_8_ + -0x18) + 8) =
           *(uint *)((long)local_820 + *(long *)(local_830._0_8_ + -0x18) + 8) & 0xffffffb5 | 8;
      std::ostream::_M_insert<unsigned_long>((ulong)local_830);
      std::__cxx11::stringbuf::str();
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)&local_a28,(char (*) [9])"uint32_t",&local_8f0,local_3c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8[0]._M_dataplus._M_p != &local_3c8[0].field_2) {
        operator_delete(local_3c8[0]._M_dataplus._M_p,local_3c8[0].field_2._M_allocated_capacity + 1
                       );
      }
      local_950._M_dataplus._M_p = (pointer)&local_950.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_950,local_a48,local_a40 + (long)local_a48);
      std::__cxx11::string::append((char *)&local_950);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3c8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3c8,"0x",2);
      *(uint *)((long)&local_3c8[0].field_2 + *(long *)(local_3c8[0]._M_dataplus._M_p + -0x18) + 8)
           = *(uint *)((long)&local_3c8[0].field_2 +
                      *(long *)(local_3c8[0]._M_dataplus._M_p + -0x18) + 8) & 0xffffffb5 | 8;
      std::ostream::_M_insert<void_const*>(local_3c8);
      std::__cxx11::stringbuf::str();
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[19],std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)&local_a28,(char (*) [19])"const char* const*",&local_950,local_540);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_540[0]._M_dataplus._M_p != &local_540[0].field_2) {
        operator_delete(local_540[0]._M_dataplus._M_p,local_540[0].field_2._M_allocated_capacity + 1
                       );
      }
      if (info->enabledApiLayerCount != 0) {
        paVar2 = &local_a68.field_2;
        paVar3 = &local_a90.field_2;
        uVar22 = 0;
        do {
          local_a68._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_a68,local_950._M_dataplus._M_p,
                     local_950._M_dataplus._M_p + local_950._M_string_length);
          std::__cxx11::string::append((char *)&local_a68);
          cVar9 = '\x01';
          if (9 < uVar22) {
            uVar20 = uVar22;
            cVar7 = '\x04';
            do {
              cVar9 = cVar7;
              uVar18 = (uint)uVar20;
              if (uVar18 < 100) {
                cVar9 = cVar9 + -2;
                goto LAB_001049d3;
              }
              if (uVar18 < 1000) {
                cVar9 = cVar9 + -1;
                goto LAB_001049d3;
              }
              if (uVar18 < 10000) goto LAB_001049d3;
              uVar20 = (uVar20 & 0xffffffff) / 10000;
              cVar7 = cVar9 + '\x04';
            } while (99999 < uVar18);
            cVar9 = cVar9 + '\x01';
          }
LAB_001049d3:
          local_a90._M_dataplus._M_p = (pointer)paVar3;
          std::__cxx11::string::_M_construct((ulong)&local_a90,cVar9);
          std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_a90._M_dataplus._M_p,(uint)local_a90._M_string_length,(uint)uVar22);
          uVar21 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a68._M_dataplus._M_p != paVar2) {
            uVar21 = local_a68.field_2._M_allocated_capacity;
          }
          uVar20 = CONCAT44(local_a90._M_string_length._4_4_,(uint)local_a90._M_string_length) +
                   local_a68._M_string_length;
          if ((ulong)uVar21 < uVar20) {
            uVar21 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a90._M_dataplus._M_p != paVar3) {
              uVar21 = local_a90.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar21 < uVar20) goto LAB_00104a34;
            puVar14 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_a90,0,(char *)0x0,(ulong)local_a68._M_dataplus._M_p);
          }
          else {
LAB_00104a34:
            puVar14 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_a68,(ulong)local_a90._M_dataplus._M_p);
          }
          local_6b8[0]._M_dataplus._M_p = (pointer)&local_6b8[0].field_2;
          psVar19 = puVar14 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar14 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar19) {
            local_6b8[0].field_2._0_8_ = *psVar19;
            local_6b8[0].field_2._8_8_ = puVar14[3];
          }
          else {
            local_6b8[0].field_2._0_8_ = *psVar19;
            local_6b8[0]._M_dataplus._M_p = (pointer)*puVar14;
          }
          local_6b8[0]._M_string_length = puVar14[1];
          *puVar14 = psVar19;
          puVar14[1] = 0;
          *(undefined1 *)psVar19 = 0;
          plVar15 = (long *)std::__cxx11::string::append((char *)local_6b8);
          local_540[0]._M_dataplus._M_p = (pointer)&local_540[0].field_2;
          psVar19 = (size_type *)(plVar15 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar15 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar19) {
            local_540[0].field_2._0_8_ = *psVar19;
            local_540[0].field_2._8_8_ = plVar15[3];
          }
          else {
            local_540[0].field_2._0_8_ = *psVar19;
            local_540[0]._M_dataplus._M_p = (pointer)*plVar15;
          }
          local_540[0]._M_string_length = plVar15[1];
          *plVar15 = (long)psVar19;
          plVar15[1] = 0;
          *(undefined1 *)(plVar15 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6b8[0]._M_dataplus._M_p != &local_6b8[0].field_2) {
            operator_delete(local_6b8[0]._M_dataplus._M_p,
                            local_6b8[0].field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a90._M_dataplus._M_p != paVar3) {
            operator_delete(local_a90._M_dataplus._M_p,local_a90.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a68._M_dataplus._M_p != paVar2) {
            operator_delete(local_a68._M_dataplus._M_p,local_a68.field_2._M_allocated_capacity + 1);
          }
          std::
          vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
          ::emplace_back<char_const(&)[19],std::__cxx11::string&,char_const*const&>
                    ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                      *)&local_a28,(char (*) [19])"const char* const*",local_540,
                     info->enabledApiLayerNames + uVar22);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_540[0]._M_dataplus._M_p != &local_540[0].field_2) {
            operator_delete(local_540[0]._M_dataplus._M_p,
                            local_540[0].field_2._M_allocated_capacity + 1);
          }
          uVar22 = uVar22 + 1;
        } while (uVar22 < info->enabledApiLayerCount);
      }
      local_a68._M_dataplus._M_p = (pointer)&local_a68.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a68,local_a48,local_a40 + (long)local_a48);
      std::__cxx11::string::append((char *)&local_a68);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_540);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_540,"0x",2);
      *(uint *)((long)&local_540[0].field_2 + *(long *)(local_540[0]._M_dataplus._M_p + -0x18) + 8)
           = *(uint *)((long)&local_540[0].field_2 +
                      *(long *)(local_540[0]._M_dataplus._M_p + -0x18) + 8) & 0xffffffb5 | 8;
      std::ostream::_M_insert<unsigned_long>((ulong)local_540);
      std::__cxx11::stringbuf::str();
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)&local_a28,(char (*) [9])"uint32_t",&local_a68,local_6b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6b8[0]._M_dataplus._M_p != &local_6b8[0].field_2) {
        operator_delete(local_6b8[0]._M_dataplus._M_p,local_6b8[0].field_2._M_allocated_capacity + 1
                       );
      }
      local_a90._M_dataplus._M_p = (pointer)&local_a90.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a90,local_a48,local_a40 + (long)local_a48);
      std::__cxx11::string::append((char *)&local_a90);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6b8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_6b8,"0x",2);
      *(uint *)((long)&local_6b8[0].field_2 + *(long *)(local_6b8[0]._M_dataplus._M_p + -0x18) + 8)
           = *(uint *)((long)&local_6b8[0].field_2 +
                      *(long *)(local_6b8[0]._M_dataplus._M_p + -0x18) + 8) & 0xffffffb5 | 8;
      std::ostream::_M_insert<void_const*>(local_6b8);
      std::__cxx11::stringbuf::str();
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[19],std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)&local_a28,(char (*) [19])"const char* const*",&local_a90,&local_9d0);
      paVar2 = &local_9d0.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_9d0._M_dataplus._M_p != paVar2) {
        operator_delete(local_9d0._M_dataplus._M_p,local_9d0.field_2._M_allocated_capacity + 1);
      }
      if (info->enabledExtensionCount != 0) {
        uVar22 = 0;
        do {
          local_9f0 = local_9e0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_9f0,local_a90._M_dataplus._M_p,
                     local_a90._M_dataplus._M_p +
                     CONCAT44(local_a90._M_string_length._4_4_,(uint)local_a90._M_string_length));
          std::__cxx11::string::append((char *)&local_9f0);
          cVar9 = '\x01';
          if (9 < uVar22) {
            uVar20 = uVar22;
            cVar7 = '\x04';
            do {
              cVar9 = cVar7;
              uVar18 = (uint)uVar20;
              if (uVar18 < 100) {
                cVar9 = cVar9 + -2;
                goto LAB_00104e30;
              }
              if (uVar18 < 1000) {
                cVar9 = cVar9 + -1;
                goto LAB_00104e30;
              }
              if (uVar18 < 10000) goto LAB_00104e30;
              uVar20 = (uVar20 & 0xffffffff) / 10000;
              cVar7 = cVar9 + '\x04';
            } while (99999 < uVar18);
            cVar9 = cVar9 + '\x01';
          }
LAB_00104e30:
          local_a10 = local_a00;
          std::__cxx11::string::_M_construct((ulong)&local_a10,cVar9);
          std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_a10,local_a08,(uint)uVar22);
          uVar20 = 0xf;
          if (local_9f0 != local_9e0) {
            uVar20 = local_9e0[0];
          }
          uVar1 = CONCAT44(uStack_a04,local_a08) + local_9e8;
          if (uVar20 < uVar1) {
            uVar20 = 0xf;
            if (local_a10 != local_a00) {
              uVar20 = local_a00[0];
            }
            if (uVar20 < uVar1) goto LAB_00104ec7;
            puVar14 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_a10,0,(char *)0x0,(ulong)local_9f0);
          }
          else {
LAB_00104ec7:
            puVar14 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_9f0,(ulong)local_a10);
          }
          plVar15 = puVar14 + 2;
          if ((long *)*puVar14 == plVar15) {
            local_980 = *plVar15;
            uStack_978 = puVar14[3];
            local_990 = &local_980;
          }
          else {
            local_980 = *plVar15;
            local_990 = (long *)*puVar14;
          }
          local_988 = puVar14[1];
          *puVar14 = plVar15;
          puVar14[1] = 0;
          *(undefined1 *)plVar15 = 0;
          plVar15 = (long *)std::__cxx11::string::append((char *)&local_990);
          psVar19 = (size_type *)(plVar15 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar15 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar19) {
            local_9d0.field_2._M_allocated_capacity = *psVar19;
            local_9d0.field_2._8_8_ = plVar15[3];
            local_9d0._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_9d0.field_2._M_allocated_capacity = *psVar19;
            local_9d0._M_dataplus._M_p = (pointer)*plVar15;
          }
          local_9d0._M_string_length = plVar15[1];
          *plVar15 = (long)psVar19;
          plVar15[1] = 0;
          *(undefined1 *)(plVar15 + 2) = 0;
          if (local_990 != &local_980) {
            operator_delete(local_990,local_980 + 1);
          }
          if (local_a10 != local_a00) {
            operator_delete(local_a10,local_a00[0] + 1);
          }
          if (local_9f0 != local_9e0) {
            operator_delete(local_9f0,local_9e0[0] + 1);
          }
          std::
          vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
          ::emplace_back<char_const(&)[19],std::__cxx11::string&,char_const*const&>
                    ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                      *)&local_a28,(char (*) [19])"const char* const*",&local_9d0,
                     info->enabledExtensionNames + uVar22);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_9d0._M_dataplus._M_p != paVar2) {
            operator_delete(local_9d0._M_dataplus._M_p,local_9d0.field_2._M_allocated_capacity + 1);
          }
          uVar22 = uVar22 + 1;
        } while (uVar22 < info->enabledExtensionCount);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6b8);
      std::ios_base::~ios_base(local_648);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a90._M_dataplus._M_p != &local_a90.field_2) {
        operator_delete(local_a90._M_dataplus._M_p,local_a90.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_540);
      std::ios_base::~ios_base(local_4d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a68._M_dataplus._M_p != &local_a68.field_2) {
        operator_delete(local_a68._M_dataplus._M_p,local_a68.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3c8);
      std::ios_base::~ios_base(local_358);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_950._M_dataplus._M_p != &local_950.field_2) {
        operator_delete(local_950._M_dataplus._M_p,local_950.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_830);
      std::ios_base::~ios_base(local_7c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_8f0._M_dataplus._M_p != &local_8f0.field_2) {
        operator_delete(local_8f0._M_dataplus._M_p,local_8f0.field_2._M_allocated_capacity + 1);
      }
      if (local_930 != local_920) {
        operator_delete(local_930,local_920[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_8d0._M_dataplus._M_p != &local_8d0.field_2) {
        operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
      }
      if (local_910 != local_900) {
        operator_delete(local_910,local_900[0] + 1);
      }
      instance = local_8b0;
      apiLayerInfo = local_a70;
      if (local_a48 != local_a38) {
        operator_delete(local_a48,local_a38[0] + 1);
        instance = local_8b0;
        apiLayerInfo = local_a70;
      }
    }
    PointerToHexString<XrInstance_T*>((XrInstance_T **)info);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[12],char_const(&)[9],std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&local_a28,(char (*) [12])"XrInstance*",(char (*) [9])"instance",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_830);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_830._0_8_ != local_820) {
      operator_delete((void *)local_830._0_8_,local_820[0]._M_allocated_capacity + 1);
    }
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(&local_848,&local_a28);
    ApiDumpLayerRecordContent(&local_848);
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_848);
    memcpy(&local_250,apiLayerInfo,0x220);
    pXVar4 = apiLayerInfo->nextInfo;
    local_250.nextInfo = pXVar4->next;
    get_inst_proc_addr = pXVar4->nextGetInstanceProcAddr;
    local_3c8[0]._M_dataplus._M_p = (pointer)*instance;
    XVar11 = (*pXVar4->nextCreateApiLayerInstance)(info,&local_250,(XrInstance *)local_3c8);
    instance_00._M_p = local_3c8[0]._M_dataplus._M_p;
    *instance = (XrInstance)local_3c8[0]._M_dataplus._M_p;
    table = (XrGeneratedDispatchTable *)operator_new(0xa58);
    memset(table,0,0xa58);
    GeneratedXrPopulateDispatchTable(table,(XrInstance)instance_00._M_p,get_inst_proc_addr);
    local_830._0_8_ = &g_instance_dispatch_mutex;
    local_830[8] = false;
    std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_830);
    local_830[8] = true;
    ppXVar16 = std::__detail::
               _Map_base<XrInstance_T_*,_std::pair<XrInstance_T_*const,_XrGeneratedDispatchTable_*>,_std::allocator<std::pair<XrInstance_T_*const,_XrGeneratedDispatchTable_*>_>,_std::__detail::_Select1st,_std::equal_to<XrInstance_T_*>,_std::hash<XrInstance_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<XrInstance_T_*,_std::pair<XrInstance_T_*const,_XrGeneratedDispatchTable_*>,_std::allocator<std::pair<XrInstance_T_*const,_XrGeneratedDispatchTable_*>_>,_std::__detail::_Select1st,_std::equal_to<XrInstance_T_*>,_std::hash<XrInstance_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&g_instance_dispatch_map,(key_type *)local_3c8);
    *ppXVar16 = table;
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_830);
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_a28);
  }
LAB_00105394:
  if (local_970 != &local_960) {
    operator_delete(local_970,CONCAT71(uStack_95f,local_960) + 1);
  }
  if (local_9b0 != &local_9a0) {
    operator_delete(local_9b0,CONCAT71(uStack_99f,local_9a0) + 1);
  }
  return XVar11;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL ApiDumpLayerXrCreateApiLayerInstance(const XrInstanceCreateInfo *info,
                                                                    const struct XrApiLayerCreateInfo *apiLayerInfo,
                                                                    XrInstance *instance) {
    try {
        PFN_xrGetInstanceProcAddr next_get_instance_proc_addr = nullptr;
        PFN_xrCreateApiLayerInstance next_create_api_layer_instance = nullptr;
        XrApiLayerCreateInfo new_api_layer_info = {};
        bool first_time = !g_record_info.initialized;

        if (!g_record_info.initialized) {
            g_record_info.initialized = true;
            g_record_info.type = RECORD_TEXT_COUT;
        }

#if !defined(ANDROID)
        std::string export_type = PlatformUtilsGetEnv("XR_API_DUMP_EXPORT_TYPE");
        std::string file_name = PlatformUtilsGetEnv("XR_API_DUMP_FILE_NAME");
#else
        // We match the pattern used by the Vulkan api_dump layer here
        // (we replace the `XR_` prefix with `debug.` and make it lowercase.)
        // adb shell "setprop debug.api_dump_file_name '/sdcard/xr_apidump.txt'"
        std::string export_type = PlatformUtilsGetAndroidSystemProperty("debug.api_dump_export_type");
        std::string file_name = PlatformUtilsGetAndroidSystemProperty("debug.api_dump_file_name");
#endif

        if (!file_name.empty()) {
            g_record_info.file_name = file_name;
            g_record_info.type = RECORD_TEXT_FILE;
        }

        if (!export_type.empty()) {
            std::string export_type_lower = export_type;
            std::transform(export_type.begin(), export_type.end(), export_type_lower.begin(),
                           [](unsigned char c) { return std::tolower(c); });

            if (export_type_lower == "text") {
                if (!g_record_info.file_name.empty()) {
                    g_record_info.type = RECORD_TEXT_FILE;
                } else {
                    g_record_info.type = RECORD_TEXT_COUT;
                }
            } else if (export_type_lower == "html" && first_time) {
                g_record_info.type = RECORD_HTML_FILE;
                if (!ApiDumpLayerWriteHtmlHeader()) {
                    return XR_ERROR_INITIALIZATION_FAILED;
                }
            } else if (export_type_lower == "code") {
                g_record_info.type = RECORD_CODE_FILE;
            }
        }

        // Validate the API layer info and next API layer info structures before we try to use them
        if (nullptr == apiLayerInfo || XR_LOADER_INTERFACE_STRUCT_API_LAYER_CREATE_INFO != apiLayerInfo->structType ||
            XR_API_LAYER_CREATE_INFO_STRUCT_VERSION > apiLayerInfo->structVersion ||
            sizeof(XrApiLayerCreateInfo) > apiLayerInfo->structSize || nullptr == apiLayerInfo->nextInfo ||
            XR_LOADER_INTERFACE_STRUCT_API_LAYER_NEXT_INFO != apiLayerInfo->nextInfo->structType ||
            XR_API_LAYER_NEXT_INFO_STRUCT_VERSION > apiLayerInfo->nextInfo->structVersion ||
            sizeof(XrApiLayerNextInfo) > apiLayerInfo->nextInfo->structSize ||
            0 != strcmp("XR_APILAYER_LUNARG_api_dump", apiLayerInfo->nextInfo->layerName) ||
            nullptr == apiLayerInfo->nextInfo->nextGetInstanceProcAddr ||
            nullptr == apiLayerInfo->nextInfo->nextCreateApiLayerInstance) {
            return XR_ERROR_INITIALIZATION_FAILED;
        }

        // Generate output for this command as if it were the standard xrCreateInstance
        std::vector<std::tuple<std::string, std::string, std::string>> contents;
        contents.emplace_back("XrResult", "xrCreateInstance", "");
        contents.emplace_back("const XrInstanceCreateInfo*", "info", PointerToHexString(info));
        if (nullptr != info) {
            std::string info_prefix = "info->";
            contents.emplace_back("XrStructureType", "info->type", std::to_string(info->type));
            std::string next_prefix = info_prefix;
            next_prefix += "next";
            // Decode the next chain if it exists
            if (!ApiDumpDecodeNextChain(nullptr, info->next, next_prefix, contents)) {
                throw std::invalid_argument("Invalid Operation");
            }
            std::string flags_prefix = info_prefix;
            flags_prefix += "createFlags";
            contents.emplace_back("XrInstanceCreateFlags", flags_prefix, std::to_string(info->createFlags));
            std::string applicationinfo_prefix = info_prefix;
            applicationinfo_prefix += "applicationInfo";
            if (!ApiDumpOutputXrStruct(nullptr, &info->applicationInfo, applicationinfo_prefix, "XrApplicationInfo", true,
                                       contents)) {
                throw std::invalid_argument("Invalid Operation");
            }
            std::string enabledapilayercount_prefix = info_prefix;
            enabledapilayercount_prefix += "enabledApiLayerCount";
            std::ostringstream oss_enabledApiLayerCount;
            oss_enabledApiLayerCount << "0x" << std::hex << (info->enabledApiLayerCount);
            contents.emplace_back("uint32_t", enabledapilayercount_prefix, oss_enabledApiLayerCount.str());
            std::string enabledapilayernames_prefix = info_prefix;
            enabledapilayernames_prefix += "enabledApiLayerNames";
            std::ostringstream oss_enabledApiLayerNames_array;
            oss_enabledApiLayerNames_array << "0x" << std::hex << (info->enabledApiLayerNames);
            contents.emplace_back("const char* const*", enabledapilayernames_prefix, oss_enabledApiLayerNames_array.str());
            for (uint32_t i = 0; i < info->enabledApiLayerCount; ++i) {
                std::string prefix = enabledapilayernames_prefix + "[" + std::to_string(i) + "]";
                contents.emplace_back("const char* const*", prefix, info->enabledApiLayerNames[i]);
            }
            std::string enabledextensioncount_prefix = info_prefix;
            enabledextensioncount_prefix += "enabledExtensionCount";
            std::ostringstream oss_enabledExtensionCount;
            oss_enabledExtensionCount << "0x" << std::hex << (info->enabledExtensionCount);
            contents.emplace_back("uint32_t", enabledextensioncount_prefix, oss_enabledExtensionCount.str());
            std::string enabledextensionnames_prefix = info_prefix;
            enabledextensionnames_prefix += "enabledExtensionNames";
            std::ostringstream oss_enabledExtensionNames_array;
            oss_enabledExtensionNames_array << "0x" << std::hex << (info->enabledExtensionNames);
            contents.emplace_back("const char* const*", enabledextensionnames_prefix, oss_enabledExtensionNames_array.str());
            for (uint32_t ii = 0; ii < info->enabledExtensionCount; ++ii) {
                std::string prefix = enabledextensionnames_prefix + "[" + std::to_string(ii) + "]";
                contents.emplace_back("const char* const*", prefix, info->enabledExtensionNames[ii]);
            }
        }

        contents.emplace_back("XrInstance*", "instance", PointerToHexString(instance));
        ApiDumpLayerRecordContent(contents);

        // Copy the contents of the layer info struct, but then move the next info up by
        // one slot so that the next layer gets information.
        memcpy(&new_api_layer_info, apiLayerInfo, sizeof(XrApiLayerCreateInfo));
        new_api_layer_info.nextInfo = apiLayerInfo->nextInfo->next;

        // Get the function pointers we need
        next_get_instance_proc_addr = apiLayerInfo->nextInfo->nextGetInstanceProcAddr;
        next_create_api_layer_instance = apiLayerInfo->nextInfo->nextCreateApiLayerInstance;

        // Create the instance
        XrInstance returned_instance = *instance;
        XrResult result = next_create_api_layer_instance(info, &new_api_layer_info, &returned_instance);
        *instance = returned_instance;

        // Create the dispatch table to the next levels
        auto *next_dispatch = new XrGeneratedDispatchTable();
        GeneratedXrPopulateDispatchTable(next_dispatch, returned_instance, next_get_instance_proc_addr);

        std::unique_lock<std::mutex> mlock(g_instance_dispatch_mutex);
        g_instance_dispatch_map[returned_instance] = next_dispatch;

        return result;
    } catch (...) {
        return XR_ERROR_INITIALIZATION_FAILED;
    }
}